

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
::binary_evaluator(binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   *this,XprType *xpr)

{
  scalar_quotient_op<double,_double> *psVar1;
  _LhsNested *xpr_00;
  _RhsNested *xpr_01;
  XprType *xpr_local;
  binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  *this_local;
  
  evaluator_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::evaluator_base((evaluator_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    *)this);
  psVar1 = CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ::functor(xpr);
  scalar_quotient_op<double,_double>::scalar_quotient_op
            ((scalar_quotient_op<double,_double> *)this,psVar1);
  xpr_00 = CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ::lhs(xpr);
  evaluator<const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>_>::
  evaluator(&this->m_lhsImpl,xpr_00);
  xpr_01 = CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ::rhs(xpr);
  evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::evaluator(&this->m_rhsImpl,xpr_01);
  return;
}

Assistant:

binary_evaluator(const XprType& xpr)
    : m_functor(xpr.functor()),
      m_lhsImpl(xpr.lhs()), 
      m_rhsImpl(xpr.rhs())  
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(functor_traits<BinaryOp>::Cost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }